

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

size_t __thiscall CoreML::Specification::Scaler::ByteSizeLong(Scaler *this)

{
  long lVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar5 = (ulong)(uint)(this->shiftvalue_).current_size_;
  lVar3 = uVar5 * 8;
  uVar7 = 0;
  if (uVar5 == 0) {
    uVar6 = 0;
    uVar5 = 0;
  }
  else {
    uVar6 = (uint)lVar3;
    if ((int)uVar6 < 0) {
      uVar5 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar6 | 1) != 0) {
        for (; (uVar6 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar5 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
  }
  this->_shiftvalue_cached_byte_size_ = uVar6;
  lVar3 = uVar5 + lVar3;
  uVar5 = (ulong)(uint)(this->scalevalue_).current_size_;
  lVar1 = uVar5 * 8;
  if (uVar5 != 0) {
    uVar7 = (uint)lVar1;
    if ((int)uVar7 < 0) {
      uVar5 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar7 | 1) != 0) {
        for (; (uVar7 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar5 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    lVar3 = lVar3 + uVar5;
  }
  this->_scalevalue_cached_byte_size_ = uVar7;
  sVar4 = lVar3 + lVar1;
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

inline int RepeatedField<Element>::size() const {
  return current_size_;
}